

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinStrReplace
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  pointer pVVar2;
  HeapEntity *pHVar3;
  long lVar4;
  HeapEntity *pHVar5;
  _func_int **pp_Var6;
  size_type __n1;
  size_type __n2;
  size_type sVar7;
  RuntimeError *__return_storage_ptr__;
  allocator_type *in_RCX;
  ulong __pos;
  Value VVar8;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  UString new_str;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_78;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_58;
  Type local_3c [3];
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"strReplace","");
  local_3c[0] = STRING;
  local_3c[1] = STRING;
  local_3c[2] = 0x13;
  __l._M_len = 3;
  __l._M_array = local_3c;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_58,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&local_78,args,&local_58);
  if (local_58.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar3 = pVVar2[1].v.h;
  lVar4._0_1_ = pHVar3[1].mark;
  lVar4._1_1_ = pHVar3[1].type;
  lVar4._2_6_ = *(undefined6 *)&pHVar3[1].field_0xa;
  if (lVar4 != 0) {
    pHVar5 = pVVar2[2].v.h;
    pp_Var6 = (pVVar2->v).h[1]._vptr_HeapEntity;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::u32string::_M_construct<char32_t*>
              ((u32string *)&local_78,pp_Var6,(long)pp_Var6 + *(long *)&(pVVar2->v).h[1].mark * 4);
    __pos = 0;
    while ((__pos < local_78._M_string_length &&
           (sVar7._0_1_ = pHVar3[1].mark, sVar7._1_1_ = pHVar3[1].type,
           sVar7._2_6_ = *(undefined6 *)&pHVar3[1].field_0xa,
           sVar7 = std::__cxx11::
                   basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                   find(&local_78,(char32_t *)pHVar3[1]._vptr_HeapEntity,__pos,sVar7),
           sVar7 != 0xffffffffffffffff))) {
      __n1._0_1_ = pHVar3[1].mark;
      __n1._1_1_ = pHVar3[1].type;
      __n1._2_6_ = *(undefined6 *)&pHVar3[1].field_0xa;
      __n2._0_1_ = pHVar5[1].mark;
      __n2._1_1_ = pHVar5[1].type;
      __n2._2_6_ = *(undefined6 *)&pHVar5[1].field_0xa;
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      replace(&local_78,sVar7,__n1,(char32_t *)pHVar5[1]._vptr_HeapEntity,__n2);
      __pos = *(long *)&pHVar5[1].mark + sVar7;
    }
    VVar8 = makeString(this,&local_78);
    (this->scratch).t = STRING;
    (this->scratch).v = VVar8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
    }
    return (AST *)0x0;
  }
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"\'from\' string must not be zero length.","");
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,(string *)&local_78);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinStrReplace(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "strReplace", args, {Value::STRING, Value::STRING, Value::STRING});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        const auto *from = static_cast<const HeapString *>(args[1].v.h);
        const auto *to = static_cast<const HeapString *>(args[2].v.h);
        if (from->value.empty()) {
          throw makeError(loc, "'from' string must not be zero length.");
        }
        UString new_str(str->value);
        UString::size_type pos = 0;
        while (pos < new_str.size()) {
            auto index = new_str.find(from->value, pos);
            if (index == new_str.npos) {
                break;
            }
            new_str.replace(index, from->value.size(), to->value);
            pos = index + to->value.size();
        }
        scratch = makeString(new_str);
        return nullptr;
    }